

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O0

upb_StringView *
google_protobuf_FileDescriptorProto_dependency
          (google_protobuf_FileDescriptorProto *msg,size_t *size)

{
  upb_Array *array;
  upb_Array *arr;
  upb_MiniTableField field;
  size_t *size_local;
  google_protobuf_FileDescriptorProto *msg_local;
  
  stack0xffffffffffffffd4 = 0x3000000003;
  field.number_dont_copy_me__upb_internal_use_only = 0xd10cffff;
  field._4_8_ = size;
  array = upb_Message_GetArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,
                     (upb_MiniTableField *)((long)&arr + 4));
  if (array == (upb_Array *)0x0) {
    if (field._4_8_ != 0) {
      *(undefined8 *)field._4_8_ = 0;
    }
    msg_local = (google_protobuf_FileDescriptorProto *)0x0;
  }
  else {
    if (field._4_8_ != 0) {
      *(size_t *)field._4_8_ = array->size_dont_copy_me__upb_internal_use_only;
    }
    msg_local = (google_protobuf_FileDescriptorProto *)upb_Array_DataPtr(array);
  }
  return (upb_StringView *)msg_local;
}

Assistant:

UPB_INLINE upb_StringView const* google_protobuf_FileDescriptorProto_dependency(const google_protobuf_FileDescriptorProto* msg, size_t* size) {
  const upb_MiniTableField field = {3, UPB_SIZE(12, 48), 0, kUpb_NoSub, 12, (int)kUpb_FieldMode_Array | (int)kUpb_LabelFlags_IsAlternate | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (upb_StringView const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}